

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O0

void saslplain_destroy(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle)

{
  LOGGER_LOG p_Var1;
  SASL_PLAIN_INSTANCE *sasl_plain_instance;
  LOGGER_LOG l;
  CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle_local;
  
  if (sasl_mechanism_concrete_handle == (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                ,"saslplain_destroy",0x83,1,"NULL sasl_mechanism_concrete_handle");
    }
  }
  else {
    if (*sasl_mechanism_concrete_handle != 0) {
      free(*sasl_mechanism_concrete_handle);
    }
    free(sasl_mechanism_concrete_handle);
  }
  return;
}

Assistant:

void saslplain_destroy(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle)
{
    if (sasl_mechanism_concrete_handle == NULL)
    {
        /* Codes_SRS_SASL_PLAIN_01_006: [If the argument `concrete_sasl_mechanism` is NULL, `saslplain_destroy` shall do nothing.] */
        LogError("NULL sasl_mechanism_concrete_handle");
    }
    else
    {
        /* Codes_SRS_SASL_PLAIN_01_005: [`saslplain_destroy` shall free all resources associated with the SASL mechanism.] */
        SASL_PLAIN_INSTANCE* sasl_plain_instance = (SASL_PLAIN_INSTANCE*)sasl_mechanism_concrete_handle;
        if (sasl_plain_instance->init_bytes != NULL)
        {
            free(sasl_plain_instance->init_bytes);
        }

        free(sasl_plain_instance);
    }
}